

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

bool __thiscall
Js::DebugDocument::FindBPStatementLocation
          (DebugDocument *this,UINT bpId,StatementLocation *statement)

{
  anon_class_24_3_ebf2fe7c map;
  bool local_21;
  StatementLocation *pSStack_20;
  bool foundStatement;
  StatementLocation *statement_local;
  DebugDocument *pDStack_10;
  UINT bpId_local;
  DebugDocument *this_local;
  
  local_21 = false;
  if (this->m_breakpointList != (BreakpointProbeList *)0x0) {
    map.statement = &stack0xffffffffffffffe0;
    map.bpId = (UINT *)((long)&statement_local + 4);
    map.foundStatement = &local_21;
    pSStack_20 = statement;
    statement_local._4_4_ = bpId;
    pDStack_10 = this;
    JsUtil::
    List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    MapUntil<Js::DebugDocument::FindBPStatementLocation(unsigned_int,Js::StatementLocation*)::__0>
              ((List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this->m_breakpointList,map);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool DebugDocument::FindBPStatementLocation(UINT bpId, StatementLocation * statement)
    {
        bool foundStatement = false;
        if (m_breakpointList != nullptr)
        {
            m_breakpointList->MapUntil([&](int index, BreakpointProbe* bpProbe) -> bool
            {
                if (bpProbe != nullptr && bpProbe->GetId() == bpId)
                {
                    bpProbe->GetStatementLocation(statement);
                    foundStatement = true;
                    return true;
                }
                return false;
            });
        }
        return foundStatement;
    }